

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator%(short lhs,SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> u;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  char local_b;
  short local_a;
  
  local_b = '\0';
  local_a = lhs;
  u = SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_a,
                 rhs.m_int);
  SafeCastHelper<char,_short,_4>::CastThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (u.m_int,&local_b);
  return (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_b;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}